

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_write.h
# Opt level: O1

uchar * stbi_zlib_compress(uchar *data,int data_len,int *out_len,int quality)

{
  byte *pbVar1;
  void **arr;
  byte bVar2;
  void *__dest;
  long lVar3;
  long lVar4;
  bool bVar5;
  uint uVar6;
  uint uVar7;
  uchar *puVar8;
  byte bVar9;
  int iVar10;
  int iVar11;
  int itemsize;
  int iVar12;
  int iVar13;
  int extraout_EDX;
  uint extraout_EDX_00;
  uint uVar14;
  void *pvVar15;
  uint uVar16;
  ulong uVar17;
  int res_3;
  ulong uVar18;
  int iVar19;
  ulong uVar20;
  ulong uVar21;
  long lVar22;
  int local_90;
  uint local_8c;
  uchar *local_88;
  void *local_80;
  ulong local_78;
  uchar *local_70;
  int local_68;
  int local_64;
  ulong local_60;
  ulong local_58;
  int *local_50;
  size_t local_48;
  ulong local_40;
  long local_38;
  
  uVar17 = (ulong)(uint)data_len;
  local_8c = 0;
  local_90 = 0;
  local_88 = (uchar *)0x0;
  local_50 = out_len;
  local_80 = malloc(0x20000);
  local_60 = 5;
  if (5 < quality) {
    local_60 = (ulong)(uint)quality;
  }
  stbiw__sbgrowf(&local_88,1,itemsize);
  iVar13 = *(int *)(local_88 + -4);
  iVar12 = iVar13 + 1;
  *(int *)(local_88 + -4) = iVar12;
  local_88[iVar13] = 'x';
  if ((local_88 == (uchar *)0x0) || (*(int *)(local_88 + -8) <= *(int *)(local_88 + -4) + 1)) {
    stbiw__sbgrowf(&local_88,1,iVar12);
  }
  iVar13 = *(int *)(local_88 + -4);
  *(int *)(local_88 + -4) = iVar13 + 1;
  local_88[iVar13] = '^';
  local_8c = 1;
  local_90 = 1;
  local_88 = stbiw__zlib_flushf(local_88,&local_8c,&local_90);
  local_8c = local_8c | 1 << ((byte)local_90 & 0x1f);
  local_90 = local_90 + 2;
  local_88 = stbiw__zlib_flushf(local_88,&local_8c,&local_90);
  pvVar15 = local_80;
  uVar6 = 0;
  local_70 = local_88;
  memset(local_80,0,0x20000);
  if (3 < data_len) {
    local_64 = data_len + -3;
    local_68 = (int)local_60 * 2;
    local_40 = local_60 & 0xffffffff;
    local_48 = local_40 * 8;
    uVar18 = 0;
    local_78 = uVar17;
    do {
      iVar13 = (int)uVar18;
      local_38 = (long)iVar13;
      uVar6 = (uint)CONCAT12(data[local_38 + 2],*(undefined2 *)(data + local_38)) * 8 ^
              (uint)CONCAT12(data[local_38 + 2],*(undefined2 *)(data + local_38));
      uVar6 = (uVar6 >> 5) + uVar6;
      uVar6 = uVar6 * 0x10 ^ uVar6;
      uVar6 = (uVar6 >> 0x11) + uVar6;
      uVar21 = (ulong)((uVar6 >> 6) + uVar6 & 0x3fff);
      __dest = *(void **)((long)pvVar15 + uVar21 * 8);
      uVar6 = 0;
      if (__dest != (void *)0x0) {
        uVar6 = *(uint *)((long)__dest + -4);
      }
      pbVar1 = data + local_38;
      if ((int)uVar6 < 1) {
        iVar12 = 3;
        lVar22 = 0;
      }
      else {
        iVar10 = iVar13 + -0x8000;
        iVar13 = (int)uVar17 - iVar13;
        uVar16 = iVar13 - 1;
        if (0x100 < uVar16) {
          uVar16 = 0x101;
        }
        iVar12 = 3;
        uVar17 = 0;
        lVar22 = 0;
        do {
          lVar3 = *(long *)((long)__dest + uVar17 * 8);
          if ((long)iVar10 < lVar3 - (long)data) {
            uVar20 = 0;
            if (0 < iVar13) {
              do {
                if (*(byte *)(lVar3 + uVar20) != pbVar1[uVar20]) goto LAB_001128be;
                uVar20 = uVar20 + 1;
              } while (uVar16 + 1 != uVar20);
              uVar20 = (ulong)(uVar16 + 1);
            }
LAB_001128be:
            iVar19 = (int)uVar20;
            iVar11 = iVar12;
            if (iVar12 < iVar19) {
              iVar11 = iVar19;
            }
            bVar5 = iVar12 <= iVar19;
            iVar12 = iVar11;
            if (bVar5) {
              lVar22 = lVar3;
            }
          }
          uVar17 = uVar17 + 1;
        } while (uVar17 != uVar6);
      }
      arr = (void **)((long)pvVar15 + uVar21 * 8);
      local_58 = uVar18;
      if (__dest == (void *)0x0) {
LAB_0011291c:
        stbiw__sbgrowf(arr,8,iVar13);
      }
      else {
        if (*(int *)((long)__dest + -4) == local_68) {
          memmove(__dest,(void *)((long)__dest + local_40 * 8),local_48);
          *(int *)((long)__dest + -4) = (int)local_60;
          iVar13 = extraout_EDX;
        }
        if ((__dest == (void *)0x0) ||
           (*(int *)((long)__dest + -8) <= *(int *)((long)__dest + -4) + 1)) goto LAB_0011291c;
      }
      pvVar15 = *arr;
      iVar13 = *(int *)((long)pvVar15 + -4);
      *(int *)((long)pvVar15 + -4) = iVar13 + 1;
      *(byte **)((long)pvVar15 + (long)iVar13 * 8) = pbVar1;
      if (lVar22 == 0) {
        lVar22 = 0;
      }
      else {
        uVar6 = (uint)*(uint3 *)(pbVar1 + 1) * 8 ^ (uint)*(uint3 *)(pbVar1 + 1);
        uVar6 = (uVar6 >> 5) + uVar6;
        uVar6 = uVar6 * 0x10 ^ uVar6;
        uVar6 = (uVar6 >> 0x11) + uVar6;
        lVar3 = *(long *)((long)local_80 + (ulong)((uVar6 >> 6) + uVar6 & 0x3fff) * 8);
        if (lVar3 == 0) {
          uVar17 = 0;
        }
        else {
          uVar17 = (ulong)*(uint *)(lVar3 + -4);
        }
        if (0 < (int)uVar17) {
          uVar16 = ~(uint)local_58;
          uVar6 = (uVar16 + (int)local_78) - 1;
          if (0x100 < uVar6) {
            uVar6 = 0x101;
          }
          uVar18 = 0;
          do {
            lVar4 = *(long *)(lVar3 + uVar18 * 8);
            if ((long)(int)((uint)local_58 - 0x7fff) < lVar4 - (long)data) {
              uVar21 = 0;
              if (0 < (int)(uVar16 + (int)local_78)) {
                do {
                  if (*(uchar *)(lVar4 + uVar21) != data[uVar21 + local_38 + 1]) goto LAB_00112a10;
                  uVar21 = uVar21 + 1;
                } while (uVar6 + 1 != uVar21);
                uVar21 = (ulong)(uVar6 + 1);
              }
LAB_00112a10:
              if (iVar12 < (int)uVar21) {
                lVar22 = 0;
                break;
              }
            }
            uVar18 = uVar18 + 1;
          } while (uVar18 != uVar17);
        }
      }
      bVar9 = (byte)local_90;
      if (lVar22 == 0) {
        bVar2 = *pbVar1;
        if (bVar2 < 0x90) {
          uVar6 = bVar2 + 0x30;
          iVar12 = 0;
          iVar13 = -8;
          do {
            iVar12 = (uVar6 & 1) + iVar12 * 2;
            uVar6 = uVar6 >> 1;
            iVar13 = iVar13 + 1;
          } while (iVar13 != 0);
          uVar6 = iVar12 << (bVar9 & 0x1f);
          local_90 = local_90 + 8;
        }
        else {
          uVar6 = bVar2 | 0x100;
          iVar12 = 0;
          iVar13 = -9;
          do {
            iVar12 = (uVar6 & 1) + iVar12 * 2;
            uVar6 = uVar6 >> 1;
            iVar13 = iVar13 + 1;
          } while (iVar13 != 0);
          uVar6 = iVar12 << (bVar9 & 0x1f);
          local_90 = local_90 + 9;
        }
        local_8c = local_8c | uVar6;
        iVar12 = 1;
        pvVar15 = local_80;
        puVar8 = local_70;
        uVar17 = local_78;
LAB_00112c55:
        puVar8 = stbiw__zlib_flushf(puVar8,&local_8c,&local_90);
      }
      else {
        iVar13 = (int)pbVar1 - (int)lVar22;
        if ((0x7fff < iVar13) || (0x102 < iVar12)) {
          local_88 = local_70;
          __assert_fail("d <= 32767 && best <= 258",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/stb_image_write.h"
                        ,0x315,"unsigned char *stbi_zlib_compress(unsigned char *, int, int *, int)"
                       );
        }
        uVar17 = 0;
        do {
          uVar18 = uVar17;
          uVar17 = uVar18 + 1;
        } while ((int)(uint)stbi_zlib_compress::lengthc[uVar18 + 1] <= iVar12);
        if (uVar18 < 0x17) {
          iVar10 = 0;
          iVar11 = -7;
          do {
            iVar10 = ((uint)uVar17 & 1) + iVar10 * 2;
            uVar17 = (ulong)((uint)uVar17 >> 1);
            iVar11 = iVar11 + 1;
          } while (iVar11 != 0);
          uVar6 = iVar10 << (bVar9 & 0x1f);
          local_90 = local_90 + 7;
        }
        else {
          uVar6 = (int)uVar17 + 0xa8;
          iVar10 = 0;
          iVar11 = -8;
          do {
            iVar10 = (uVar6 & 1) + iVar10 * 2;
            uVar6 = uVar6 >> 1;
            iVar11 = iVar11 + 1;
          } while (iVar11 != 0);
          uVar6 = iVar10 << (bVar9 & 0x1f);
          local_90 = local_90 + 8;
        }
        local_8c = local_8c | uVar6;
        puVar8 = stbiw__zlib_flushf(local_70,&local_8c,&local_90);
        uVar18 = uVar18 & 0xffffffff;
        if (0xffffffffffffffeb < uVar18 - 0x1c) {
          local_8c = local_8c |
                     iVar12 - (uint)stbi_zlib_compress::lengthc[uVar18] << ((byte)local_90 & 0x1f);
          local_90 = (uint)""[uVar18] + local_90;
          puVar8 = stbiw__zlib_flushf(puVar8,&local_8c,&local_90);
        }
        uVar17 = local_78;
        pvVar15 = local_80;
        uVar18 = 0xffffffffffffffff;
        do {
          lVar22 = uVar18 + 2;
          uVar18 = uVar18 + 1;
        } while ((int)(uint)stbi_zlib_compress::distc[lVar22] <= iVar13);
        iVar10 = 0;
        iVar11 = -5;
        uVar21 = uVar18 & 0xffffffff;
        do {
          iVar10 = ((uint)uVar21 & 1) + iVar10 * 2;
          uVar21 = uVar21 >> 1;
          iVar11 = iVar11 + 1;
        } while (iVar11 != 0);
        local_8c = local_8c | iVar10 << ((byte)local_90 & 0x1f);
        local_90 = local_90 + 5;
        puVar8 = stbiw__zlib_flushf(puVar8,&local_8c,&local_90);
        if (3 < uVar18) {
          local_8c = local_8c |
                     iVar13 - (uint)stbi_zlib_compress::distc[uVar18 & 0xffffffff] <<
                     ((byte)local_90 & 0x1f);
          local_90 = (uint)""[uVar18 & 0xffffffff] + local_90;
          goto LAB_00112c55;
        }
      }
      data_len = (int)uVar17;
      uVar6 = iVar12 + (int)local_58;
      uVar18 = (ulong)uVar6;
      local_70 = puVar8;
    } while ((int)uVar6 < local_64);
  }
  local_88 = local_70;
  puVar8 = local_70;
  if ((int)uVar6 < data_len) {
    lVar22 = (long)(int)uVar6;
    do {
      bVar9 = data[lVar22];
      if (bVar9 < 0x90) {
        uVar6 = bVar9 + 0x30;
        iVar13 = 0;
        iVar12 = -8;
        do {
          iVar13 = (uVar6 & 1) + iVar13 * 2;
          uVar6 = uVar6 >> 1;
          iVar12 = iVar12 + 1;
        } while (iVar12 != 0);
        uVar6 = iVar13 << ((byte)local_90 & 0x1f);
        local_90 = local_90 + 8;
      }
      else {
        uVar6 = bVar9 | 0x100;
        iVar13 = 0;
        iVar12 = -9;
        do {
          iVar13 = (uVar6 & 1) + iVar13 * 2;
          uVar6 = uVar6 >> 1;
          iVar12 = iVar12 + 1;
        } while (iVar12 != 0);
        uVar6 = iVar13 << ((byte)local_90 & 0x1f);
        local_90 = local_90 + 9;
      }
      local_8c = local_8c | uVar6;
      puVar8 = stbiw__zlib_flushf(puVar8,&local_8c,&local_90);
      lVar22 = lVar22 + 1;
    } while ((uint)lVar22 != data_len);
  }
  local_90 = local_90 + 7;
  local_88 = puVar8;
  puVar8 = stbiw__zlib_flushf(puVar8,&local_8c,&local_90);
  if (local_90 != 0) {
    do {
      local_90 = local_90 + 1;
      puVar8 = stbiw__zlib_flushf(puVar8,&local_8c,&local_90);
    } while (local_90 != 0);
  }
  pvVar15 = local_80;
  lVar22 = 0;
  local_88 = puVar8;
  do {
    lVar3 = *(long *)((long)pvVar15 + lVar22 * 8);
    if (lVar3 != 0) {
      free((void *)(lVar3 + -8));
    }
    lVar22 = lVar22 + 1;
  } while (lVar22 != 0x4000);
  free(pvVar15);
  if (data_len < 1) {
    uVar16 = 0;
    uVar14 = 1;
    uVar6 = extraout_EDX_00;
  }
  else {
    uVar7 = (uint)data_len % 0x15b0;
    uVar14 = 1;
    uVar16 = 0;
    uVar17 = 0;
    do {
      if (uVar7 != 0) {
        uVar18 = 0;
        do {
          uVar14 = uVar14 + data[uVar18 + uVar17];
          uVar16 = uVar16 + uVar14;
          uVar18 = uVar18 + 1;
        } while (uVar7 != uVar18);
        uVar14 = uVar14 % 0xfff1;
        uVar16 = uVar16 % 0xfff1;
      }
      uVar6 = (int)uVar17 + uVar7;
      uVar17 = (ulong)uVar6;
      uVar7 = 0x15b0;
    } while ((int)uVar6 < data_len);
  }
  if ((puVar8 == (uchar *)0x0) || (*(int *)(puVar8 + -8) <= *(int *)(puVar8 + -4) + 1)) {
    stbiw__sbgrowf(&local_88,1,uVar6);
  }
  iVar13 = *(int *)(local_88 + -4);
  iVar12 = iVar13 + 1;
  *(int *)(local_88 + -4) = iVar12;
  local_88[iVar13] = (uchar)(uVar16 >> 8);
  if ((local_88 == (uchar *)0x0) || (*(int *)(local_88 + -8) <= *(int *)(local_88 + -4) + 1)) {
    stbiw__sbgrowf(&local_88,1,iVar12);
  }
  iVar13 = *(int *)(local_88 + -4);
  iVar12 = iVar13 + 1;
  *(int *)(local_88 + -4) = iVar12;
  local_88[iVar13] = (uchar)uVar16;
  if ((local_88 == (uchar *)0x0) || (*(int *)(local_88 + -8) <= *(int *)(local_88 + -4) + 1)) {
    stbiw__sbgrowf(&local_88,1,iVar12);
  }
  iVar13 = *(int *)(local_88 + -4);
  iVar12 = iVar13 + 1;
  *(int *)(local_88 + -4) = iVar12;
  local_88[iVar13] = (uchar)(uVar14 >> 8);
  if ((local_88 == (uchar *)0x0) || (*(int *)(local_88 + -8) <= *(int *)(local_88 + -4) + 1)) {
    stbiw__sbgrowf(&local_88,1,iVar12);
  }
  iVar13 = *(int *)(local_88 + -4);
  *(int *)(local_88 + -4) = iVar13 + 1;
  local_88[iVar13] = (uchar)uVar14;
  iVar13 = *(int *)(local_88 + -4);
  *local_50 = iVar13;
  puVar8 = (uchar *)memmove(local_88 + -8,local_88,(long)iVar13);
  return puVar8;
}

Assistant:

unsigned char * stbi_zlib_compress(unsigned char *data, int data_len, int *out_len, int quality)
{
   static unsigned short lengthc[] = { 3,4,5,6,7,8,9,10,11,13,15,17,19,23,27,31,35,43,51,59,67,83,99,115,131,163,195,227,258, 259 };
   static unsigned char  lengtheb[]= { 0,0,0,0,0,0,0, 0, 1, 1, 1, 1, 2, 2, 2, 2, 3, 3, 3, 3, 4, 4, 4,  4,  5,  5,  5,  5,  0 };
   static unsigned short distc[]   = { 1,2,3,4,5,7,9,13,17,25,33,49,65,97,129,193,257,385,513,769,1025,1537,2049,3073,4097,6145,8193,12289,16385,24577, 32768 };
   static unsigned char  disteb[]  = { 0,0,0,0,1,1,2,2,3,3,4,4,5,5,6,6,7,7,8,8,9,9,10,10,11,11,12,12,13,13 };
   unsigned int bitbuf=0;
   int i,j, bitcount=0;
   unsigned char *out = NULL;
   unsigned char ***hash_table = (unsigned char***) STBIW_MALLOC(stbiw__ZHASH * sizeof(char**));
   if (quality < 5) quality = 5;

   stbiw__sbpush(out, 0x78);   // DEFLATE 32K window
   stbiw__sbpush(out, 0x5e);   // FLEVEL = 1
   stbiw__zlib_add(1,1);  // BFINAL = 1
   stbiw__zlib_add(1,2);  // BTYPE = 1 -- fixed huffman

   for (i=0; i < stbiw__ZHASH; ++i)
      hash_table[i] = NULL;

   i=0;
   while (i < data_len-3) {
      // hash next 3 bytes of data to be compressed
      int h = stbiw__zhash(data+i)&(stbiw__ZHASH-1), best=3;
      unsigned char *bestloc = 0;
      unsigned char **hlist = hash_table[h];
      int n = stbiw__sbcount(hlist);
      for (j=0; j < n; ++j) {
         if (hlist[j]-data > i-32768) { // if entry lies within window
            int d = stbiw__zlib_countm(hlist[j], data+i, data_len-i);
            if (d >= best) best=d,bestloc=hlist[j];
         }
      }
      // when hash table entry is too long, delete half the entries
      if (hash_table[h] && stbiw__sbn(hash_table[h]) == 2*quality) {
         STBIW_MEMMOVE(hash_table[h], hash_table[h]+quality, sizeof(hash_table[h][0])*quality);
         stbiw__sbn(hash_table[h]) = quality;
      }
      stbiw__sbpush(hash_table[h],data+i);

      if (bestloc) {
         // "lazy matching" - check match at *next* byte, and if it's better, do cur byte as literal
         h = stbiw__zhash(data+i+1)&(stbiw__ZHASH-1);
         hlist = hash_table[h];
         n = stbiw__sbcount(hlist);
         for (j=0; j < n; ++j) {
            if (hlist[j]-data > i-32767) {
               int e = stbiw__zlib_countm(hlist[j], data+i+1, data_len-i-1);
               if (e > best) { // if next match is better, bail on current match
                  bestloc = NULL;
                  break;
               }
            }
         }
      }

      if (bestloc) {
         int d = (int) (data+i - bestloc); // distance back
         STBIW_ASSERT(d <= 32767 && best <= 258);
         for (j=0; best > lengthc[j+1]-1; ++j);
         stbiw__zlib_huff(j+257);
         if (lengtheb[j]) stbiw__zlib_add(best - lengthc[j], lengtheb[j]);
         for (j=0; d > distc[j+1]-1; ++j);
         stbiw__zlib_add(stbiw__zlib_bitrev(j,5),5);
         if (disteb[j]) stbiw__zlib_add(d - distc[j], disteb[j]);
         i += best;
      } else {
         stbiw__zlib_huffb(data[i]);
         ++i;
      }
   }
   // write out final bytes
   for (;i < data_len; ++i)
      stbiw__zlib_huffb(data[i]);
   stbiw__zlib_huff(256); // end of block
   // pad with 0 bits to byte boundary
   while (bitcount)
      stbiw__zlib_add(0,1);

   for (i=0; i < stbiw__ZHASH; ++i)
      (void) stbiw__sbfree(hash_table[i]);
   STBIW_FREE(hash_table);

   {
      // compute adler32 on input
      unsigned int s1=1, s2=0;
      int blocklen = (int) (data_len % 5552);
      j=0;
      while (j < data_len) {
         for (i=0; i < blocklen; ++i) s1 += data[j+i], s2 += s1;
         s1 %= 65521, s2 %= 65521;
         j += blocklen;
         blocklen = 5552;
      }
      stbiw__sbpush(out, STBIW_UCHAR(s2 >> 8));
      stbiw__sbpush(out, STBIW_UCHAR(s2));
      stbiw__sbpush(out, STBIW_UCHAR(s1 >> 8));
      stbiw__sbpush(out, STBIW_UCHAR(s1));
   }
   *out_len = stbiw__sbn(out);
   // make returned pointer freeable
   STBIW_MEMMOVE(stbiw__sbraw(out), out, *out_len);
   return (unsigned char *) stbiw__sbraw(out);
}